

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
FastPForLib::FastBinaryPacking<8u>::name_abi_cxx11_(FastBinaryPacking<8U> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  string local_30 [12];
  uint in_stack_ffffffffffffffdc;
  
  __lhs = local_30;
  __rhs = in_RDI;
  std::__cxx11::to_string(in_stack_ffffffffffffffdc);
  std::operator+((char *)__lhs,__rhs);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string name() const override {
    return "FastBinaryPacking" + std::to_string(MiniBlockSize);
  }